

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O2

int __thiscall Wave::get_min_entropy(Wave *this,minstd_rand *gen)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  uint i;
  ulong uVar4;
  result_type_conflict rVar5;
  double dVar6;
  double local_48;
  uniform_real_distribution<double> dis;
  
  if (this->is_impossible == false) {
    dis._M_param._M_b = this->min_abs_half_plogp;
    dis._M_param._M_a = 0.0;
    local_48 = INFINITY;
    uVar3 = 0xffffffffffffffff;
    for (uVar4 = 0; iVar2 = (int)uVar3, uVar4 < this->size; uVar4 = uVar4 + 1) {
      dVar6 = local_48;
      if (((this->memoisation).nb_patterns.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4] != 1) &&
         (dVar1 = (this->memoisation).entropy.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar4], dVar1 <= local_48)) {
        rVar5 = std::uniform_real_distribution<double>::operator()(&dis,gen);
        dVar6 = dVar1 + rVar5;
        if (dVar6 < local_48) {
          uVar3 = uVar4;
        }
        uVar3 = uVar3 & 0xffffffff;
        if (local_48 <= dVar6) {
          dVar6 = local_48;
        }
      }
      local_48 = dVar6;
    }
  }
  else {
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int Wave::get_min_entropy(std::minstd_rand &gen) const noexcept {
  if (is_impossible) {
    return -2;
  }

  std::uniform_real_distribution<> dis(0, min_abs_half_plogp);

  // The minimum entropy (plus a small noise)
  double min = std::numeric_limits<double>::infinity();
  int argmin = -1;

  for (unsigned i = 0; i < size; i++) {

    // If the cell is decided, we do not compute the entropy (which is equal
    // to 0).
    double nb_patterns_local = memoisation.nb_patterns[i];
    if (nb_patterns_local == 1) {
      continue;
    }

    // Otherwise, we take the memoised entropy.
    double entropy = memoisation.entropy[i];

    // We first check if the entropy is less than the minimum.
    // This is important to reduce noise computation (which is not
    // negligible).
    if (entropy <= min) {

      // Then, we add noise to decide randomly which will be chosen.
      // noise is smaller than the smallest p * log(p), so the minimum entropy
      // will always be chosen.
      double noise = dis(gen);
      if (entropy + noise < min) {
        min = entropy + noise;
        argmin = i;
      }
    }
  }

  return argmin;
}